

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lockedpool.cpp
# Opt level: O0

void * __thiscall Arena::alloc(Arena *this,size_t size)

{
  long lVar1;
  bool bVar2;
  size_t sVar3;
  pointer ppVar4;
  unordered_map<void_*,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>_>_>
  *this_00;
  char **__args;
  mapped_type *pmVar5;
  pointer ppVar6;
  long in_RDI;
  long in_FS_OFFSET;
  char *free_chunk;
  iterator it_remaining;
  _Node_iterator<std::pair<void_*const,_unsigned_long>,_false,_false> allocated;
  size_t size_remaining;
  iterator size_ptr_it;
  _Rb_tree_iterator<std::pair<const_unsigned_long,_void_*>_> *in_stack_ffffffffffffff08;
  multimap<unsigned_long,_void_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_void_*>_>_>
  *in_stack_ffffffffffffff10;
  unordered_map<void_*,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>_>_>
  *in_stack_ffffffffffffff18;
  multimap<unsigned_long,_void_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_void_*>_>_>
  *in_stack_ffffffffffffff20;
  iterator in_stack_ffffffffffffff28;
  void *local_98;
  _Base_ptr local_80;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  sVar3 = align_up((size_t)in_stack_ffffffffffffff18,(size_t)in_stack_ffffffffffffff10);
  if (sVar3 == 0) {
    local_98 = (void *)0x0;
  }
  else {
    std::
    multimap<unsigned_long,_void_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_void_*>_>_>
    ::lower_bound(in_stack_ffffffffffffff10,(key_type *)in_stack_ffffffffffffff08);
    std::
    multimap<unsigned_long,_void_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_void_*>_>_>
    ::end(in_stack_ffffffffffffff10);
    bVar2 = std::operator==((_Self *)in_stack_ffffffffffffff18,(_Self *)in_stack_ffffffffffffff10);
    if (bVar2) {
      local_98 = (void *)0x0;
    }
    else {
      std::_Rb_tree_iterator<std::pair<const_unsigned_long,_void_*>_>::operator->
                (in_stack_ffffffffffffff08);
      std::_Rb_tree_iterator<std::pair<const_unsigned_long,_void_*>_>::operator->
                (in_stack_ffffffffffffff08);
      std::
      unordered_map<void*,unsigned_long,std::hash<void*>,std::equal_to<void*>,std::allocator<std::pair<void*const,unsigned_long>>>
      ::emplace<char*,unsigned_long&>
                ((unordered_map<void_*,_unsigned_long,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                  *)in_stack_ffffffffffffff28._M_node,(char **)in_stack_ffffffffffffff20,
                 (unsigned_long *)in_stack_ffffffffffffff18);
      std::_Rb_tree_iterator<std::pair<const_unsigned_long,_void_*>_>::operator->
                (in_stack_ffffffffffffff08);
      std::
      unordered_map<void_*,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>_>_>
      ::erase(in_stack_ffffffffffffff18,(key_type *)in_stack_ffffffffffffff10);
      ppVar4 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_void_*>_>::operator->
                         (in_stack_ffffffffffffff08);
      if (ppVar4->first == sVar3) {
        in_stack_ffffffffffffff28._M_node = (_Base_ptr)(in_RDI + 0x38);
        std::_Rb_tree_iterator<std::pair<const_unsigned_long,_void_*>_>::operator->
                  (in_stack_ffffffffffffff08);
        std::
        unordered_map<void_*,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>_>_>
        ::erase(in_stack_ffffffffffffff18,(key_type *)in_stack_ffffffffffffff10);
      }
      else {
        this_00 = (unordered_map<void_*,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>_>_>
                   *)(in_RDI + 8);
        std::_Rb_tree_iterator<std::pair<const_unsigned_long,_void_*>_>::operator->
                  (in_stack_ffffffffffffff08);
        std::
        multimap<unsigned_long,void*,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,void*>>>
        ::emplace<unsigned_long_const&,void*&>
                  (in_stack_ffffffffffffff20,(unsigned_long *)this_00,
                   (void **)in_stack_ffffffffffffff10);
        std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>::
        _Rb_tree_const_iterator
                  ((_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_> *)
                   in_stack_ffffffffffffff08,(iterator *)0xffef6c);
        __args = (char **)(in_RDI + 0x38);
        std::_Rb_tree_iterator<std::pair<const_unsigned_long,_void_*>_>::operator->
                  (in_stack_ffffffffffffff08);
        pmVar5 = std::
                 unordered_map<void_*,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>_>_>
                 ::operator[](this_00,(key_type *)in_stack_ffffffffffffff10);
        pmVar5->_M_node = local_80;
        std::
        unordered_map<void*,std::_Rb_tree_const_iterator<std::pair<unsigned_long_const,void*>>,std::hash<void*>,std::equal_to<void*>,std::allocator<std::pair<void*const,std::_Rb_tree_const_iterator<std::pair<unsigned_long_const,void*>>>>>
        ::emplace<char*,std::_Rb_tree_iterator<std::pair<unsigned_long_const,void*>>&>
                  ((unordered_map<void_*,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>_>_>
                    *)in_stack_ffffffffffffff28._M_node,__args,
                   (_Rb_tree_iterator<std::pair<const_unsigned_long,_void_*>_> *)this_00);
      }
      std::
      multimap<unsigned_long,void*,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,void*>>>
      ::erase_abi_cxx11_(in_stack_ffffffffffffff10,in_stack_ffffffffffffff28);
      ppVar6 = std::__detail::_Node_iterator<std::pair<void_*const,_unsigned_long>,_false,_false>::
               operator->((_Node_iterator<std::pair<void_*const,_unsigned_long>,_false,_false> *)
                          in_stack_ffffffffffffff08);
      local_98 = ppVar6->first;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_98;
  }
  __stack_chk_fail();
}

Assistant:

void* Arena::alloc(size_t size)
{
    // Round to next multiple of alignment
    size = align_up(size, alignment);

    // Don't handle zero-sized chunks
    if (size == 0)
        return nullptr;

    // Pick a large enough free-chunk. Returns an iterator pointing to the first element that is not less than key.
    // This allocation strategy is best-fit. According to "Dynamic Storage Allocation: A Survey and Critical Review",
    // Wilson et. al. 1995, https://www.scs.stanford.edu/14wi-cs140/sched/readings/wilson.pdf, best-fit and first-fit
    // policies seem to work well in practice.
    auto size_ptr_it = size_to_free_chunk.lower_bound(size);
    if (size_ptr_it == size_to_free_chunk.end())
        return nullptr;

    // Create the used-chunk, taking its space from the end of the free-chunk
    const size_t size_remaining = size_ptr_it->first - size;
    char* const free_chunk = static_cast<char*>(size_ptr_it->second);
    auto allocated = chunks_used.emplace(free_chunk + size_remaining, size).first;
    chunks_free_end.erase(free_chunk + size_ptr_it->first);
    if (size_ptr_it->first == size) {
        // whole chunk is used up
        chunks_free.erase(size_ptr_it->second);
    } else {
        // still some memory left in the chunk
        auto it_remaining = size_to_free_chunk.emplace(size_remaining, size_ptr_it->second);
        chunks_free[size_ptr_it->second] = it_remaining;
        chunks_free_end.emplace(free_chunk + size_remaining, it_remaining);
    }
    size_to_free_chunk.erase(size_ptr_it);

    return allocated->first;
}